

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

Regexp * __thiscall
re2::Regexp::Walker<re2::Regexp_*>::WalkInternal
          (Walker<re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *psVar6;
  undefined4 extraout_var;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 aVar7;
  void *pvVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WalkState<re2::Regexp_*> local_238;
  Regexp **local_208;
  Regexp **sub;
  Regexp *pRStack_1f8;
  bool stop;
  Regexp *t;
  WalkState<re2::Regexp_*> *s;
  LogMessage local_1a8;
  byte local_21;
  Regexp *pRStack_20;
  bool use_copy_local;
  Regexp *top_arg_local;
  Regexp *re_local;
  Walker<re2::Regexp_*> *this_local;
  int extraout_var_00;
  
  local_21 = use_copy;
  pRStack_20 = top_arg;
  top_arg_local = re;
  re_local = (Regexp *)this;
  Reset(this);
  if (top_arg_local == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/walker-inl.h"
               ,0xa3);
    poVar5 = LogMessage::stream(&local_1a8);
    std::operator<<((ostream *)poVar5,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
  }
  psVar6 = &this->stack_;
  WalkState<re2::Regexp_*>::WalkState((WalkState<re2::Regexp_*> *)&s,top_arg_local,pRStack_20);
  std::
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  ::push(psVar6,(value_type *)&s);
  do {
    while( true ) {
      t = (Regexp *)
          std::
          stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
          ::top(&this->stack_);
      top_arg_local = ((reference)t)->re;
      if (((reference)t)->n != -1) break;
      iVar4 = this->max_visits_ + -1;
      this->max_visits_ = iVar4;
      if (iVar4 < 0) {
        this->stopped_early_ = true;
        iVar4 = (*this->_vptr_Walker[5])(this,top_arg_local,((reference)t)->parent_arg);
        pRStack_1f8 = (Regexp *)CONCAT44(extraout_var,iVar4);
      }
      else {
        sub._7_1_ = 0;
        aVar7.max_ = (*this->_vptr_Walker[2])
                               (this,top_arg_local,((reference)t)->parent_arg,(long)&sub + 7);
        aVar7.min_ = extraout_var_00;
        (t->field_7).field_0 = aVar7;
        if ((sub._7_1_ & 1) == 0) {
          *(undefined4 *)&t->field_5 = 0;
          t[1].op_ = '\0';
          t[1].simple_ = '\0';
          t[1].parse_flags_ = 0;
          t[1].ref_ = 0;
          t[1].nsub_ = 0;
          if (top_arg_local->nsub_ == 1) {
            *(undefined1 **)(t + 1) = (undefined1 *)((long)&t->field_7 + 8);
          }
          else if (1 < top_arg_local->nsub_) {
            pvVar8 = operator_new__((size_t)this);
            *(void **)(t + 1) = pvVar8;
          }
          break;
        }
        pRStack_1f8 = (Regexp *)(t->field_7).field_3.cc_;
      }
LAB_0037dc67:
      std::
      stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
      ::pop(&this->stack_);
      bVar3 = std::
              stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
              ::empty(&this->stack_);
      if (bVar3) {
        return pRStack_1f8;
      }
      t = (Regexp *)
          std::
          stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
          ::top(&this->stack_);
      if (((reference)t)->child_args == (Regexp **)0x0) {
        ((reference)t)->child_arg = pRStack_1f8;
      }
      else {
        ((reference)t)->child_args[((reference)t)->n] = pRStack_1f8;
      }
      ((reference)t)->n = ((reference)t)->n + 1;
    }
    if ((top_arg_local->nsub_ == 0) ||
       (local_208 = Regexp::sub(top_arg_local),
       (int)(uint)top_arg_local->nsub_ <= *(int *)&t->field_5)) {
      uVar1._0_1_ = t[1].op_;
      uVar1._1_1_ = t[1].simple_;
      uVar1._2_2_ = t[1].parse_flags_;
      uVar1._4_2_ = t[1].ref_;
      uVar1._6_2_ = t[1].nsub_;
      iVar4 = (*this->_vptr_Walker[3])
                        (this,top_arg_local,t->down_,(t->field_7).field_3.cc_,uVar1,
                         (ulong)*(uint *)&t->field_5);
      pRStack_1f8 = (Regexp *)CONCAT44(extraout_var_02,iVar4);
      if ((1 < top_arg_local->nsub_) &&
         (lVar2._0_1_ = t[1].op_, lVar2._1_1_ = t[1].simple_, lVar2._2_2_ = t[1].parse_flags_,
         lVar2._4_2_ = t[1].ref_, lVar2._6_2_ = t[1].nsub_, lVar2 != 0)) {
        operator_delete__((void *)CONCAT17(sub._7_1_,sub._0_7_));
      }
      goto LAB_0037dc67;
    }
    if ((((local_21 & 1) == 0) || (*(int *)&t->field_5 < 1)) ||
       (local_208[*(int *)&t->field_5 + -1] != local_208[*(int *)&t->field_5])) {
      psVar6 = &this->stack_;
      WalkState<re2::Regexp_*>::WalkState
                (&local_238,local_208[*(int *)&t->field_5],(Regexp *)(t->field_7).field_3.cc_);
      std::
      stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
      ::push(psVar6,&local_238);
    }
    else {
      iVar4 = (*this->_vptr_Walker[4])
                        (this,*(undefined8 *)
                               (*(long *)(t + 1) + (long)(*(int *)&t->field_5 + -1) * 8));
      *(ulong *)(*(long *)(t + 1) + (long)*(int *)&t->field_5 * 8) = CONCAT44(extraout_var_01,iVar4)
      ;
      *(int *)&t->field_5 = *(int *)&t->field_5 + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}